

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall DQuickSaveMenu::DQuickSaveMenu(DQuickSaveMenu *this,bool playsound)

{
  char *pcVar1;
  FString local_20;
  FString tempstring;
  bool playsound_local;
  DQuickSaveMenu *this_local;
  
  tempstring.Chars._7_1_ = playsound;
  FName::FName((FName *)&tempstring,NAME_None);
  DMessageBoxMenu::DMessageBoxMenu
            (&this->super_DMessageBoxMenu,(DMenu *)0x0,(char *)0x0,0,false,(FName *)&tempstring);
  (this->super_DMessageBoxMenu).super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009ee7b8;
  FString::FString(&local_20);
  pcVar1 = FStringTable::operator()(&GStrings,"QSPROMPT");
  FString::Format(&local_20,pcVar1,quickSaveSlot);
  pcVar1 = FString::operator_cast_to_char_(&local_20);
  DMessageBoxMenu::Init
            (&this->super_DMessageBoxMenu,(DMenu *)0x0,pcVar1,0,(bool)(tempstring.Chars._7_1_ & 1));
  FString::~FString(&local_20);
  return;
}

Assistant:

DQuickSaveMenu::DQuickSaveMenu(bool playsound)
{
	FString tempstring;

	tempstring.Format(GStrings("QSPROMPT"), quickSaveSlot->Title);
	Init(NULL, tempstring, 0, playsound);
}